

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_encrypt_then_mac_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  if (buf != (uchar *)0x0) {
    mbedtls_ssl_send_alert_message(ssl,'\x02','2');
    return -0x7900;
  }
  if (((ssl->conf->field_0x175 & 4) != 0) && (ssl->minor_ver != 0)) {
    ssl->session_negotiate->encrypt_then_mac = 1;
  }
  return 0;
}

Assistant:

static int ssl_parse_encrypt_then_mac_ext( mbedtls_ssl_context *ssl,
                                      const unsigned char *buf,
                                      size_t len )
{
    if( len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    ((void) buf);

    if( ssl->conf->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        ssl->session_negotiate->encrypt_then_mac = MBEDTLS_SSL_ETM_ENABLED;
    }

    return( 0 );
}